

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Functions.cpp
# Opt level: O0

string_view RenX::translateWinTypePlain(WinType winType)

{
  string_view sVar1;
  size_t sStack_18;
  WinType winType_local;
  char *local_10;
  
  switch(winType) {
  case Score:
    sStack_18 = scoreWinTypePlainTranslation._M_len;
    local_10 = scoreWinTypePlainTranslation._M_str;
    break;
  case Base:
    sStack_18 = baseWinTypePlainTranslation._M_len;
    local_10 = baseWinTypePlainTranslation._M_str;
    break;
  case Beacon:
    sStack_18 = beaconWinTypePlainTranslation._M_len;
    local_10 = beaconWinTypePlainTranslation._M_str;
    break;
  case Tie:
    sStack_18 = tieWinTypePlainTranslation._M_len;
    local_10 = tieWinTypePlainTranslation._M_str;
    break;
  case Shutdown:
    sStack_18 = shutdownWinTypePlainTranslation._M_len;
    local_10 = shutdownWinTypePlainTranslation._M_str;
    break;
  case Surrender:
    sStack_18 = surrenderWinTypePlainTranslation._M_len;
    local_10 = surrenderWinTypePlainTranslation._M_str;
    break;
  case Unknown:
  default:
    sStack_18 = unknownWinTypePlainTranslation._M_len;
    local_10 = unknownWinTypePlainTranslation._M_str;
  }
  sVar1._M_str = local_10;
  sVar1._M_len = sStack_18;
  return sVar1;
}

Assistant:

std::string_view RenX::translateWinTypePlain(RenX::WinType winType)
{
	switch (winType)
	{
	case RenX::WinType::Score:
		return scoreWinTypePlainTranslation;
	case RenX::WinType::Base:
		return baseWinTypePlainTranslation;
	case RenX::WinType::Beacon:
		return beaconWinTypePlainTranslation;
	case RenX::WinType::Tie:
		return tieWinTypePlainTranslation;
	case RenX::WinType::Shutdown:
		return shutdownWinTypePlainTranslation;
	case RenX::WinType::Surrender:
		return surrenderWinTypePlainTranslation;
	case RenX::WinType::Unknown:
	default:
		return unknownWinTypePlainTranslation;
	}
}